

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void moveresults(lua_State *L,StkId res,int nres,int wanted)

{
  long lVar1;
  StkId pSVar2;
  TValue *io2_1;
  TValue *io1_1;
  ptrdiff_t savedres;
  TValue *io2;
  TValue *io1;
  int i;
  StkId firstresult;
  int wanted_local;
  int nres_local;
  StkId res_local;
  lua_State *L_local;
  
  firstresult._0_4_ = nres;
  _wanted_local = res;
  if (wanted != -1) {
    if (wanted == 0) {
      (L->top).p = res;
      return;
    }
    if (wanted == 1) {
      if (nres == 0) {
        (res->val).tt_ = '\0';
      }
      else {
        pSVar2 = (L->top).p;
        (res->val).value_ = pSVar2[-(long)nres].val.value_;
        (res->val).tt_ = pSVar2[-(long)nres].val.tt_;
      }
      (L->top).p = res + 1;
      return;
    }
    firstresult._0_4_ = wanted;
    if (wanted < -1) {
      L->ci->callstatus = L->ci->callstatus | 0x200;
      (L->ci->u2).funcidx = nres;
      _wanted_local = luaF_close(L,res,-1,1);
      L->ci->callstatus = L->ci->callstatus & 0xfdff;
      if (L->hookmask != 0) {
        lVar1 = (L->stack).offset;
        rethook(L,L->ci,nres);
        _wanted_local = (StkId)((long)(L->stack).p + ((long)_wanted_local - lVar1));
      }
      firstresult._0_4_ = -3 - wanted;
      if ((int)firstresult == -1) {
        firstresult._0_4_ = nres;
      }
    }
  }
  pSVar2 = (L->top).p;
  firstresult._4_4_ = nres;
  if ((int)firstresult < nres) {
    firstresult._4_4_ = (int)firstresult;
  }
  for (io1._4_4_ = 0; io1._4_4_ < firstresult._4_4_; io1._4_4_ = io1._4_4_ + 1) {
    _wanted_local[io1._4_4_].val.value_ = pSVar2[(long)io1._4_4_ - (long)nres].val.value_;
    _wanted_local[io1._4_4_].val.tt_ = pSVar2[(long)io1._4_4_ - (long)nres].val.tt_;
  }
  for (; io1._4_4_ < (int)firstresult; io1._4_4_ = io1._4_4_ + 1) {
    (&_wanted_local->val)[io1._4_4_].tt_ = '\0';
  }
  (L->top).p = _wanted_local + (int)firstresult;
  return;
}

Assistant:

l_sinline void moveresults (lua_State *L, StkId res, int nres, int wanted) {
  StkId firstresult;
  int i;
  switch (wanted) {  /* handle typical cases separately */
    case 0:  /* no values needed */
      L->top.p = res;
      return;
    case 1:  /* one value needed */
      if (nres == 0)   /* no results? */
        setnilvalue(s2v(res));  /* adjust with nil */
      else  /* at least one result */
        setobjs2s(L, res, L->top.p - nres);  /* move it to proper place */
      L->top.p = res + 1;
      return;
    case LUA_MULTRET:
      wanted = nres;  /* we want all results */
      break;
    default:  /* two/more results and/or to-be-closed variables */
      if (hastocloseCfunc(wanted)) {  /* to-be-closed variables? */
        L->ci->callstatus |= CIST_CLSRET;  /* in case of yields */
        L->ci->u2.nres = nres;
        res = luaF_close(L, res, CLOSEKTOP, 1);
        L->ci->callstatus &= ~CIST_CLSRET;
        if (L->hookmask) {  /* if needed, call hook after '__close's */
          ptrdiff_t savedres = savestack(L, res);
          rethook(L, L->ci, nres);
          res = restorestack(L, savedres);  /* hook can move stack */
        }
        wanted = decodeNresults(wanted);
        if (wanted == LUA_MULTRET)
          wanted = nres;  /* we want all results */
      }
      break;
  }
  /* generic case */
  firstresult = L->top.p - nres;  /* index of first result */
  if (nres > wanted)  /* extra results? */
    nres = wanted;  /* don't need them */
  for (i = 0; i < nres; i++)  /* move all results to correct place */
    setobjs2s(L, res + i, firstresult + i);
  for (; i < wanted; i++)  /* complete wanted number of results */
    setnilvalue(s2v(res + i));
  L->top.p = res + wanted;  /* top points after the last result */
}